

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::split_edge(PolyConnectivity *this,EdgeHandle _eh,VertexHandle _vh)

{
  bool bVar1;
  HalfedgeHandle _heh;
  VertexHandle _vh_00;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _nheh;
  BaseHandle local_c8;
  BaseHandle local_c4;
  BaseHandle local_c0;
  BaseHandle local_bc;
  BaseHandle local_b8;
  BaseHandle local_b4;
  BaseHandle local_b0;
  BaseHandle local_ac;
  BaseHandle local_a8;
  BaseHandle local_a4;
  BaseHandle local_a0;
  BaseHandle local_9c;
  BaseHandle local_98;
  BaseHandle local_94;
  BaseHandle local_90;
  int local_8c;
  BaseHandle local_88;
  BaseHandle local_84;
  BaseHandle local_80;
  BaseHandle local_7c;
  BaseHandle local_78;
  BaseHandle local_74;
  BaseHandle local_70;
  int local_6c;
  BaseHandle local_68;
  BaseHandle local_64;
  BaseHandle local_60;
  BaseHandle local_5c;
  BaseHandle local_58;
  BaseHandle local_54;
  BaseHandle local_50;
  HalfedgeHandle new_e;
  bool boundary1;
  bool boundary0;
  HalfedgeHandle nh1;
  HalfedgeHandle ph0;
  VertexHandle vfrom;
  HalfedgeHandle h1;
  HalfedgeHandle h0;
  PolyConnectivity *this_local;
  VertexHandle _vh_local;
  EdgeHandle _eh_local;
  
  h1 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,0);
  _heh = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,1);
  _vh_00 = ArrayKernel::from_vertex_handle(&this->super_ArrayKernel,h1);
  _heh_00 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,h1);
  _nheh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
  bVar1 = is_boundary(this,h1);
  local_50 = _heh.super_BaseHandle.idx_;
  new_e.super_BaseHandle.idx_._3_1_ = is_boundary(this,_heh);
  local_5c = h1.super_BaseHandle.idx_;
  local_58.idx_ = (int)ArrayKernel::from_vertex_handle(&this->super_ArrayKernel,h1);
  local_60 = _vh.super_BaseHandle.idx_;
  local_54.idx_ =
       (int)ArrayKernel::new_edge(&this->super_ArrayKernel,(VertexHandle)local_58.idx_,_vh);
  local_68 = _vh.super_BaseHandle.idx_;
  local_64 = _heh.super_BaseHandle.idx_;
  ArrayKernel::set_vertex_handle(&this->super_ArrayKernel,_heh,_vh);
  local_6c = local_54.idx_;
  local_70 = h1.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_54.idx_,h1);
  local_7c.idx_ = local_54.idx_;
  local_74 = _heh.super_BaseHandle.idx_;
  local_78.idx_ = (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_54.idx_)
  ;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)local_74.idx_,(HalfedgeHandle)local_78.idx_);
  local_84.idx_ = local_54.idx_;
  local_80 = _heh_00.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,_heh_00,(HalfedgeHandle)local_54.idx_);
  local_8c = local_54.idx_;
  local_88.idx_ = (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_54.idx_)
  ;
  local_90 = _nheh.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)local_88.idx_,_nheh);
  if (bVar1) {
    local_a0.idx_ = local_54.idx_;
    ArrayKernel::set_boundary(&this->super_ArrayKernel,(HalfedgeHandle)local_54.idx_);
  }
  else {
    local_94.idx_ = local_54.idx_;
    local_9c = h1.super_BaseHandle.idx_;
    local_98.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,h1);
    ArrayKernel::set_face_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)local_94.idx_,(FaceHandle)local_98.idx_);
  }
  if ((new_e.super_BaseHandle.idx_._3_1_ & 1) == 0) {
    local_a8.idx_ = local_54.idx_;
    local_a4.idx_ =
         (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_54.idx_);
    local_b0 = _heh.super_BaseHandle.idx_;
    local_ac.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,_heh);
    ArrayKernel::set_face_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)local_a4.idx_,(FaceHandle)local_ac.idx_);
  }
  else {
    local_b8.idx_ = local_54.idx_;
    local_b4.idx_ =
         (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,local_54.idx_);
    ArrayKernel::set_boundary(&this->super_ArrayKernel,(HalfedgeHandle)local_b4.idx_);
  }
  local_c0 = h1.super_BaseHandle.idx_;
  local_bc = _vh.super_BaseHandle.idx_;
  ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,_vh,h1);
  local_c4 = _vh.super_BaseHandle.idx_;
  adjust_outgoing_halfedge(this,_vh);
  local_c8.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh_00);
  bVar1 = BaseHandle::operator==(&local_c8,&h1.super_BaseHandle);
  if (bVar1) {
    ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,_vh_00,(HalfedgeHandle)local_54.idx_);
    adjust_outgoing_halfedge(this,_vh_00);
  }
  return;
}

Assistant:

void PolyConnectivity::split_edge(EdgeHandle _eh, VertexHandle _vh)
{
  HalfedgeHandle h0 = halfedge_handle(_eh, 0);
  HalfedgeHandle h1 = halfedge_handle(_eh, 1);
  
  VertexHandle vfrom = from_vertex_handle(h0);

  HalfedgeHandle ph0 = prev_halfedge_handle(h0);
  //HalfedgeHandle ph1 = prev_halfedge_handle(h1);
  
  //HalfedgeHandle nh0 = next_halfedge_handle(h0);
  HalfedgeHandle nh1 = next_halfedge_handle(h1);
  
  bool boundary0 = is_boundary(h0);
  bool boundary1 = is_boundary(h1);
  
  //add the new edge
  HalfedgeHandle new_e = new_edge(from_vertex_handle(h0), _vh);
  
  //fix the vertex of the opposite halfedge
  set_vertex_handle(h1, _vh);
  
  //fix the halfedge connectivity
  set_next_halfedge_handle(new_e, h0);
  set_next_halfedge_handle(h1, opposite_halfedge_handle(new_e));
  
  set_next_halfedge_handle(ph0, new_e);
  set_next_halfedge_handle(opposite_halfedge_handle(new_e), nh1);
  
//  set_prev_halfedge_handle(new_e, ph0);
//  set_prev_halfedge_handle(opposite_halfedge_handle(new_e), h1);
  
//  set_prev_halfedge_handle(nh1, opposite_halfedge_handle(new_e));
//  set_prev_halfedge_handle(h0, new_e);
  
  if (!boundary0)
  {
    set_face_handle(new_e, face_handle(h0));
  }
  else
  {
    set_boundary(new_e);
  }
  
  if (!boundary1)
  {
    set_face_handle(opposite_halfedge_handle(new_e), face_handle(h1));
  }
  else
  {
    set_boundary(opposite_halfedge_handle(new_e));
  }

  set_halfedge_handle( _vh, h0 );
  adjust_outgoing_halfedge( _vh );
  
  if (halfedge_handle(vfrom) == h0)
  {
    set_halfedge_handle(vfrom, new_e);
    adjust_outgoing_halfedge( vfrom );
  }
}